

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O2

LabelInstr * __thiscall
IRBuilderAsmJs::CreateLabel(IRBuilderAsmJs *this,BranchInstr *branchInstr,uint *offset)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  Instr *this_00;
  LabelInstr *pLVar5;
  Instr *this_01;
  
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  this_01 = (Instr *)0x0;
  while (this_01 == (Instr *)0x0) {
    uVar3 = *offset;
    if (this->m_offsetToInstructionCount <= uVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x434,"(offset < m_offsetToInstructionCount)",
                         "offset < m_offsetToInstructionCount");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
      uVar3 = *offset;
    }
    this_01 = this->m_offsetToInstruction[uVar3];
    *offset = uVar3 + 1;
  }
  bVar2 = true;
  if (this_01->m_prev != (Instr *)0x0) {
    this_00 = IR::Instr::GetPrevRealInstrOrLabel(this_01);
    if (this_00 != (Instr *)0x0) {
      if ((this_00->m_kind == InstrKindProfiledLabel) || (this_00->m_kind == InstrKindLabel)) {
        pLVar5 = IR::Instr::AsLabelInstr(this_00);
        return pLVar5;
      }
      bVar2 = false;
      goto LAB_004b8a22;
    }
  }
  this_00 = (Instr *)0x0;
LAB_004b8a22:
  pLVar5 = IR::LabelInstr::New(Label,this->m_func,false);
  IR::Instr::SetByteCodeOffset(&pLVar5->super_Instr,*offset);
  if (bVar2) {
    IR::Instr::InsertBefore(this_01,&pLVar5->super_Instr);
  }
  else {
    IR::Instr::InsertAfter(this_00,&pLVar5->super_Instr);
  }
  return pLVar5;
}

Assistant:

IR::LabelInstr *
IRBuilderAsmJs::CreateLabel(IR::BranchInstr * branchInstr, uint & offset)
{
    IR::Instr * targetInstr = nullptr;
    while (targetInstr == nullptr)
    {
        AssertOrFailFast(offset < m_offsetToInstructionCount);
        targetInstr = m_offsetToInstruction[offset];
        ++offset;
    }

    IR::Instr *instrPrev = targetInstr->m_prev;

    if (instrPrev)
    {
        instrPrev = targetInstr->GetPrevRealInstrOrLabel();
    }

    IR::LabelInstr * labelInstr;
    if (instrPrev && instrPrev->IsLabelInstr())
    {
        // Found an existing label at the right offset. Just reuse it.
        labelInstr = instrPrev->AsLabelInstr();
    }
    else
    {
        // No label at the desired offset. Create one.
        labelInstr = IR::LabelInstr::New(Js::OpCode::Label, m_func);
        labelInstr->SetByteCodeOffset(offset);
        if (instrPrev)
        {
            instrPrev->InsertAfter(labelInstr);
        }
        else
        {
            targetInstr->InsertBefore(labelInstr);
        }
    }
    return labelInstr;
}